

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vpmsumd_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong local_48;
  __uint128_t prod [2];
  int j;
  int i;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  
  for (prod[1]._12_4_ = 1; -1 < prod[1]._12_4_; prod[1]._12_4_ = prod[1]._12_4_ + -1) {
    lVar2 = (long)prod[1]._12_4_;
    *(undefined8 *)(prod + lVar2) = 0;
    *(undefined8 *)((long)prod + lVar2 * 0x10 + -8) = 0;
    for (prod[1]._8_4_ = 0; (int)prod[1]._8_4_ < 0x40; prod[1]._8_4_ = prod[1]._8_4_ + 1) {
      bVar3 = (byte)prod[1]._8_4_;
      if ((a->u64[prod[1]._12_4_] & 1L << (bVar3 & 0x3f)) != 0) {
        lVar2 = (long)prod[1]._12_4_;
        uVar4 = b->u64[lVar2] << (bVar3 & 0x3f);
        uVar5 = uVar4;
        uVar1 = 0L << (bVar3 & 0x3f) | b->u64[lVar2] >> 0x40 - (bVar3 & 0x3f);
        if ((prod[1]._8_4_ & 0x40) != 0) {
          uVar5 = 0;
          uVar1 = uVar4;
        }
        uVar4 = *(ulong *)((long)prod + lVar2 * 0x10 + -8);
        *(ulong *)(prod + lVar2) = (ulong)prod[lVar2] ^ uVar1;
        *(ulong *)((long)prod + lVar2 * 0x10 + -8) = uVar4 ^ uVar5;
      }
    }
  }
  r->u64[1] = (ulong)prod[0] ^ (ulong)prod[1];
  r->u64[0] = local_48 ^ prod[0]._8_8_;
  return;
}

Assistant:

void helper_vpmsumd(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{

#ifdef CONFIG_INT128
    int i, j;
    __uint128_t prod[2];

    VECTOR_FOR_INORDER_I(i, u64) {
        prod[i] = 0;
        for (j = 0; j < 64; j++) {
            if (a->u64[i] & (1ull << j)) {
                prod[i] ^= (((__uint128_t)b->u64[i]) << j);
            }
        }
    }

    r->u128 = prod[0] ^ prod[1];

#else
    int i, j;
    ppc_avr_t prod[2];

    VECTOR_FOR_INORDER_I(i, u64) {
        prod[i].VsrD(1) = prod[i].VsrD(0) = 0;
        for (j = 0; j < 64; j++) {
            if (a->u64[i] & (1ull << j)) {
                ppc_avr_t bshift;
                if (j == 0) {
                    bshift.VsrD(0) = 0;
                    bshift.VsrD(1) = b->u64[i];
                } else {
                    bshift.VsrD(0) = b->u64[i] >> (64 - j);
                    bshift.VsrD(1) = b->u64[i] << j;
                }
                prod[i].VsrD(1) ^= bshift.VsrD(1);
                prod[i].VsrD(0) ^= bshift.VsrD(0);
            }
        }
    }

    r->VsrD(1) = prod[0].VsrD(1) ^ prod[1].VsrD(1);
    r->VsrD(0) = prod[0].VsrD(0) ^ prod[1].VsrD(0);
#endif
}